

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  ImDrawList *pIVar1;
  ImGuiNavMoveResult *pIVar2;
  ImGuiNextWindowData *pIVar3;
  int *piVar4;
  ImVector<float> *this;
  ImVec2 *pIVar5;
  ImVec2 *pIVar6;
  ImFontAtlas *pIVar7;
  char *pcVar8;
  ImVec2 IVar9;
  undefined1 auVar10 [16];
  byte bVar11;
  ImGuiContext *pIVar12;
  ImGuiContext *pIVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  int n;
  ImGuiID IVar18;
  ImGuiKeyModFlags IVar19;
  ImGuiInputSource IVar20;
  int iVar21;
  ImFont **ppIVar22;
  long lVar23;
  ImFont *font;
  ImGuiWindow *pIVar24;
  ImGuiPopupData *pIVar25;
  ImGuiWindow **ppIVar26;
  float *pfVar27;
  ImGuiTable *table;
  ImRect *pIVar28;
  int i;
  ImGuiID IVar29;
  ImGuiWindow *window;
  long lVar30;
  ImGuiWindow *parent;
  ImGuiWindow *pIVar31;
  ImGuiWindow *old_nav_window;
  bool *pbVar32;
  ImGuiContext *pIVar33;
  int i_1;
  ImGuiNavDirSourceFlags dir_sources;
  int i_00;
  float *pfVar34;
  long lVar35;
  ImGuiNavLayer IVar36;
  float *pfVar37;
  ImGuiNavMoveResult *pIVar38;
  byte bVar39;
  uint uVar40;
  uint uVar41;
  float fVar42;
  float fVar43;
  ImVec2 IVar44;
  ImVec2 IVar45;
  ImVec2 IVar46;
  ImVec2 IVar48;
  double dVar47;
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  long lStack_70;
  ImRect local_48;
  ImGuiContext *local_38;
  
  pIVar12 = GImGui;
  bVar39 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0xec5,"void ImGui::NewFrame()");
  }
  CallContextHooks(GImGui,ImGuiContextHookType_NewFramePre);
  pIVar33 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b32,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  iVar21 = GImGui->FrameCount;
  if ((GImGui->IO).DeltaTime <= 0.0) {
    if (iVar21 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x1b33,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  else if ((iVar21 != 0) && (GImGui->FrameCountEnded != iVar21)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b34,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b35,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar7 = (GImGui->IO).Fonts;
  if ((pIVar7->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b36,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  ppIVar22 = ImVector<ImFont_*>::operator[](&pIVar7->Fonts,0);
  if ((*ppIVar22)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b37,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((pIVar33->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b38,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((pIVar33->Style).CircleSegmentMaxError <= 0.0) {
    __assert_fail("g.Style.CircleSegmentMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b39,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar42 = (pIVar33->Style).Alpha;
  if ((fVar42 < 0.0) || (1.0 < fVar42)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b3a,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((pIVar33->Style).WindowMinSize.x < 1.0) || ((pIVar33->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b3b,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (pIVar33->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b3c,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar23 = 0;
  while (lVar23 != 0x16) {
    piVar4 = (pIVar33->IO).KeyMap + lVar23;
    lVar23 = lVar23 + 1;
    if (0x200 < *piVar4 + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown)))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x1b3e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  if ((((pIVar33->IO).ConfigFlags & 1) != 0) && ((pIVar33->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b42,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((pIVar33->IO).ConfigWindowsResizeFromEdges == true) &&
     (((pIVar33->IO).BackendFlags & 2) == 0)) {
    (pIVar33->IO).ConfigWindowsResizeFromEdges = false;
  }
  pIVar33 = GImGui;
  if (GImGui->SettingsLoaded == false) {
    if ((GImGui->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x273b,"void ImGui::UpdateSettings()");
    }
    pcVar8 = (GImGui->IO).IniFilename;
    if (pcVar8 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar8);
    }
    pIVar33->SettingsLoaded = true;
  }
  if ((0.0 < pIVar33->SettingsDirtyTimer) &&
     (fVar42 = pIVar33->SettingsDirtyTimer - (pIVar33->IO).DeltaTime,
     pIVar33->SettingsDirtyTimer = fVar42, fVar42 <= 0.0)) {
    pcVar8 = (pIVar33->IO).IniFilename;
    if (pcVar8 == (char *)0x0) {
      (pIVar33->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar8);
    }
    pIVar33->SettingsDirtyTimer = 0.0;
  }
  pIVar12->Time = (double)(pIVar12->IO).DeltaTime + pIVar12->Time;
  pIVar12->WithinFrameScope = true;
  pIVar12->FrameCount = pIVar12->FrameCount + 1;
  pIVar12->TooltipOverrideCount = 0;
  pIVar12->WindowsActiveCount = 0;
  ImVector<unsigned_int>::resize(&pIVar12->MenusIdSubmittedThisFrame,0);
  fVar42 = (pIVar12->IO).DeltaTime;
  iVar21 = pIVar12->FramerateSecPerFrameIdx;
  pIVar12->FramerateSecPerFrameAccum =
       (fVar42 - pIVar12->FramerateSecPerFrame[iVar21]) + pIVar12->FramerateSecPerFrameAccum;
  pIVar12->FramerateSecPerFrame[iVar21] = fVar42;
  pIVar12->FramerateSecPerFrameIdx = (iVar21 + 1) % 0x78;
  uVar40 = -(uint)(0.0 < pIVar12->FramerateSecPerFrameAccum);
  (pIVar12->IO).Framerate =
       (float)(~uVar40 & 0x7f7fffff |
              (uint)(1.0 / (pIVar12->FramerateSecPerFrameAccum / 120.0)) & uVar40);
  ((pIVar12->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  if (pIVar12->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0xee0,"void ImGui::NewFrame()");
  }
  fVar42 = (pIVar12->IO).DisplaySize.x;
  fVar50 = (pIVar12->IO).DisplaySize.y;
  (pIVar12->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar12->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar12->DrawListSharedData).ClipRectFullscreen.z = fVar42;
  (pIVar12->DrawListSharedData).ClipRectFullscreen.w = fVar50;
  fVar42 = (pIVar12->Style).CircleSegmentMaxError;
  (pIVar12->DrawListSharedData).CurveTessellationTol = (pIVar12->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleSegmentMaxError(&pIVar12->DrawListSharedData,fVar42);
  bVar14 = (pIVar12->Style).AntiAliasedLines;
  uVar40 = (uint)bVar14;
  (pIVar12->DrawListSharedData).InitialFlags = (uint)bVar14;
  if (((pIVar12->Style).AntiAliasedLinesUseTex == true) &&
     ((pIVar12->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar40 = bVar14 | 2;
    (pIVar12->DrawListSharedData).InitialFlags = uVar40;
  }
  if ((pIVar12->Style).AntiAliasedFill == true) {
    uVar40 = uVar40 | 4;
    (pIVar12->DrawListSharedData).InitialFlags = uVar40;
  }
  if (((pIVar12->IO).BackendFlags & 8) != 0) {
    (pIVar12->DrawListSharedData).InitialFlags = uVar40 | 8;
  }
  pIVar1 = &pIVar12->BackgroundDrawList;
  ImDrawList::_ResetForNewFrame(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar12->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  pIVar1 = &pIVar12->ForegroundDrawList;
  ImDrawList::_ResetForNewFrame(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar12->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  (pIVar12->DrawData).Valid = false;
  (pIVar12->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar12->DrawData).CmdListsCount = 0;
  (pIVar12->DrawData).TotalIdxCount = 0;
  (pIVar12->DrawData).TotalVtxCount = 0;
  (pIVar12->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(pIVar12->DrawData).DisplayPos.y = 0;
  (pIVar12->DrawData).DisplaySize.x = 0.0;
  (pIVar12->DrawData).DisplaySize.y = 0.0;
  (pIVar12->DrawData).FramebufferScale.x = 0.0;
  (pIVar12->DrawData).FramebufferScale.y = 0.0;
  if ((pIVar12->DragDropActive == true) &&
     (IVar29 = (pIVar12->DragDropPayload).SourceId, IVar29 == pIVar12->ActiveId)) {
    KeepAliveID(IVar29);
  }
  if (pIVar12->HoveredIdPreviousFrame == 0) {
    IVar29 = pIVar12->HoveredId;
    pIVar12->HoveredIdTimer = 0.0;
    pIVar12->HoveredIdNotActiveTimer = 0.0;
    if (IVar29 == 0) goto LAB_001728bf;
LAB_00172894:
    fVar42 = (pIVar12->IO).DeltaTime;
    pIVar12->HoveredIdTimer = pIVar12->HoveredIdTimer + fVar42;
    IVar18 = IVar29;
    if (pIVar12->ActiveId != IVar29) {
      pIVar12->HoveredIdNotActiveTimer = fVar42 + pIVar12->HoveredIdNotActiveTimer;
      IVar18 = pIVar12->ActiveId;
    }
  }
  else {
    IVar29 = pIVar12->HoveredId;
    if (IVar29 != 0) {
      if (pIVar12->ActiveId == IVar29) {
        pIVar12->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_00172894;
    }
LAB_001728bf:
    IVar29 = 0;
    IVar18 = pIVar12->ActiveId;
  }
  pIVar12->HoveredIdPreviousFrame = IVar29;
  pIVar12->HoveredIdPreviousFrameUsingMouseWheel = pIVar12->HoveredIdUsingMouseWheel;
  pIVar12->HoveredId = 0;
  pIVar12->HoveredIdAllowOverlap = false;
  pIVar12->HoveredIdUsingMouseWheel = false;
  pIVar12->HoveredIdDisabled = false;
  if (((pIVar12->ActiveIdIsAlive != IVar18) && (IVar18 != 0)) &&
     (pIVar12->ActiveIdPreviousFrame == IVar18)) {
    ClearActiveID();
    IVar18 = pIVar12->ActiveId;
  }
  fVar42 = (pIVar12->IO).DeltaTime;
  if (IVar18 != 0) {
    pIVar12->ActiveIdTimer = pIVar12->ActiveIdTimer + fVar42;
  }
  pIVar12->LastActiveIdTimer = pIVar12->LastActiveIdTimer + fVar42;
  pIVar12->ActiveIdPreviousFrame = IVar18;
  pIVar12->ActiveIdPreviousFrameWindow = pIVar12->ActiveIdWindow;
  pIVar12->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar12->ActiveIdHasBeenEditedBefore;
  pIVar12->ActiveIdIsAlive = 0;
  pIVar12->ActiveIdHasBeenEditedThisFrame = false;
  pIVar12->ActiveIdPreviousFrameIsAlive = false;
  pIVar12->ActiveIdIsJustActivated = false;
  if (pIVar12->TempInputId == 0) {
LAB_001729bb:
    if (IVar18 == 0) {
      pIVar12->ActiveIdUsingNavDirMask = 0;
      pIVar12->ActiveIdUsingNavInputMask = 0;
      pIVar12->ActiveIdUsingKeyInputMask = 0;
    }
  }
  else if (IVar18 != pIVar12->TempInputId) {
    pIVar12->TempInputId = 0;
    goto LAB_001729bb;
  }
  pIVar12->DragDropAcceptIdPrev = pIVar12->DragDropAcceptIdCurr;
  pIVar12->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar12->DragDropAcceptIdCurr = 0;
  pIVar12->DragDropWithinSource = false;
  pIVar12->DragDropWithinTarget = false;
  pIVar12->DragDropHoldJustPressedId = 0;
  IVar19 = GetMergedKeyModFlags();
  (pIVar12->IO).KeyMods = IVar19;
  memcpy((pIVar12->IO).KeysDownDurationPrev,(pIVar12->IO).KeysDownDuration,0x800);
  for (lVar23 = 0x144; pIVar33 = GImGui, lVar23 != 0x344; lVar23 = lVar23 + 1) {
    fVar50 = -1.0;
    if (*(char *)((long)(pIVar12->IO).KeyMap + lVar23 + -0x3c) == '\x01') {
      fVar51 = *(float *)((long)pIVar12 + lVar23 * 4 + -0x70);
      fVar50 = 0.0;
      if (0.0 <= fVar51) {
        fVar50 = fVar51 + fVar42;
      }
    }
    *(float *)((long)pIVar12 + lVar23 * 4 + -0x70) = fVar50;
  }
  (GImGui->IO).WantSetMousePos = false;
  pIVar33->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  pIVar33->NavWrapRequestFlags = 0;
  uVar40 = (pIVar33->IO).ConfigFlags;
  if (((uVar40 & 2) == 0) || (((pIVar33->IO).BackendFlags & 1) == 0)) {
    bVar11 = 0;
  }
  else if ((pIVar33->NavInputSource == ImGuiInputSource_NavGamepad) ||
          ((((pIVar33->IO).NavInputs[0] <= 0.0 && ((pIVar33->IO).NavInputs[2] <= 0.0)) &&
           (((pIVar33->IO).NavInputs[1] <= 0.0 &&
            (((((pIVar33->IO).NavInputs[3] <= 0.0 && ((pIVar33->IO).NavInputs[4] <= 0.0)) &&
              ((pIVar33->IO).NavInputs[5] <= 0.0)) &&
             (((pIVar33->IO).NavInputs[6] <= 0.0 && ((pIVar33->IO).NavInputs[7] <= 0.0)))))))))) {
    bVar11 = 1;
  }
  else {
    bVar11 = 1;
    pIVar33->NavInputSource = ImGuiInputSource_NavGamepad;
  }
  if ((uVar40 & 1) != 0) {
    bVar14 = IsKeyDown((pIVar33->IO).KeyMap[0xc]);
    if (bVar14) {
      (pIVar33->IO).NavInputs[0] = 1.0;
      pIVar33->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar33->IO).KeyMap[0xd]);
    if (bVar14) {
      (pIVar33->IO).NavInputs[2] = 1.0;
      pIVar33->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar33->IO).KeyMap[0xe]);
    if (bVar14) {
      (pIVar33->IO).NavInputs[1] = 1.0;
      pIVar33->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar33->IO).KeyMap[1]);
    if (bVar14) {
      (pIVar33->IO).NavInputs[0x11] = 1.0;
      pIVar33->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar33->IO).KeyMap[2]);
    if (bVar14) {
      (pIVar33->IO).NavInputs[0x12] = 1.0;
      pIVar33->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar33->IO).KeyMap[3]);
    if (bVar14) {
      (pIVar33->IO).NavInputs[0x13] = 1.0;
      pIVar33->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar33->IO).KeyMap[4]);
    if (bVar14) {
      (pIVar33->IO).NavInputs[0x14] = 1.0;
      pIVar33->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = (pIVar33->IO).KeyCtrl;
    if (bVar14 == true) {
      (pIVar33->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar33->IO).KeyShift == true) {
      (pIVar33->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar14 == false) && ((pIVar33->IO).KeyAlt != false)) {
      (pIVar33->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar27 = (pIVar33->IO).NavInputsDownDuration;
  pfVar34 = pfVar27;
  pfVar37 = (pIVar33->IO).NavInputsDownDurationPrev;
  for (lVar23 = 0x15; lVar23 != 0; lVar23 = lVar23 + -1) {
    *pfVar37 = *pfVar34;
    pfVar34 = pfVar34 + (ulong)bVar39 * -2 + 1;
    pfVar37 = pfVar37 + (ulong)bVar39 * -2 + 1;
  }
  for (lVar23 = 0; pIVar13 = GImGui, lVar23 != 0x15; lVar23 = lVar23 + 1) {
    fVar42 = -1.0;
    if (0.0 < (pIVar33->IO).NavInputs[lVar23]) {
      fVar42 = 0.0;
      if (0.0 <= pfVar27[lVar23]) {
        fVar42 = pfVar27[lVar23] + (pIVar33->IO).DeltaTime;
      }
    }
    pfVar27[lVar23] = fVar42;
  }
  if ((pIVar33->NavInitResultId != 0) &&
     (((pIVar33->NavDisableHighlight != true || (pIVar33->NavInitRequestFromMove == true)) &&
      (GImGui->NavWindow != (ImGuiWindow *)0x0)))) {
    if (GImGui->NavInitRequestFromMove == true) {
      SetNavIDWithRectRel(GImGui->NavInitResultId,GImGui->NavLayer,0,&GImGui->NavInitResultRectRel);
    }
    else {
      SetNavID(GImGui->NavInitResultId,GImGui->NavLayer,0);
    }
    IVar44 = (pIVar13->NavInitResultRectRel).Max;
    pIVar5 = &pIVar13->NavWindow->NavRectRel[pIVar13->NavLayer].Min;
    *pIVar5 = (pIVar13->NavInitResultRectRel).Min;
    pIVar5[1] = IVar44;
  }
  pIVar33->NavInitRequest = false;
  pIVar33->NavInitRequestFromMove = false;
  pIVar33->NavInitResultId = 0;
  pIVar33->NavJustMovedToId = 0;
  pIVar13 = GImGui;
  if (pIVar33->NavMoveRequest == true) {
    IVar29 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar29 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar13->NavDisableHighlight = false;
        pIVar13->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar2 = &GImGui->NavMoveResultOther;
      pIVar38 = &GImGui->NavMoveResultLocal;
      if (IVar29 == 0) {
        pIVar38 = pIVar2;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar29 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar29 != 0)) &&
         (IVar29 != GImGui->NavId)) {
        pIVar38 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (pIVar38 == pIVar2) {
LAB_00172ddc:
        pIVar38 = pIVar2;
      }
      else if (((GImGui->NavMoveResultOther).ID != 0) &&
              (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar42 = (GImGui->NavMoveResultOther).DistBox;
        fVar50 = pIVar38->DistBox;
        if (fVar50 <= fVar42) {
          if (((fVar42 != fVar50) || (NAN(fVar42) || NAN(fVar50))) ||
             (pfVar27 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar38->DistCenter < *pfVar27 || pIVar38->DistCenter == *pfVar27)) goto LAB_00172ddf;
        }
        goto LAB_00172ddc;
      }
LAB_00172ddf:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
         (pIVar24 = pIVar38->Window, pIVar24 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                      ,0x2399,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
          IVar44 = (pIVar38->RectRel).Min;
          IVar45 = (pIVar38->RectRel).Max;
          fVar42 = (pIVar24->Pos).x;
          fVar50 = (pIVar24->Pos).y;
          local_48.Max.x = IVar45.x + fVar42;
          local_48.Max.y = IVar45.y + fVar50;
          local_48.Min.y = IVar44.y + fVar50;
          local_48.Min.x = IVar44.x + fVar42;
          IVar44 = ScrollToBringRectIntoView(pIVar38->Window,&local_48);
        }
        else {
          fVar42 = 0.0;
          if (GImGui->NavMoveDir == 2) {
            fVar42 = (pIVar24->ScrollMax).y;
          }
          (pIVar24->ScrollTarget).y = fVar42;
          (pIVar24->ScrollTargetCenterRatio).y = 0.0;
          IVar44 = (ImVec2)((ulong)(uint)((pIVar24->Scroll).y - fVar42) << 0x20);
          (pIVar24->ScrollTargetEdgeSnapDist).y = 0.0;
        }
        fVar42 = (pIVar38->RectRel).Min.y;
        fVar50 = (pIVar38->RectRel).Max.x;
        fVar51 = (pIVar38->RectRel).Max.y;
        (pIVar38->RectRel).Min.x = (pIVar38->RectRel).Min.x - IVar44.x;
        (pIVar38->RectRel).Min.y = fVar42 - IVar44.y;
        (pIVar38->RectRel).Max.x = fVar50 - IVar44.x;
        (pIVar38->RectRel).Max.y = fVar51 - IVar44.y;
      }
      ClearActiveID();
      pIVar13->NavWindow = pIVar38->Window;
      IVar29 = pIVar38->ID;
      if (pIVar13->NavId == IVar29) {
        IVar18 = pIVar38->FocusScopeId;
      }
      else {
        pIVar13->NavJustMovedToId = IVar29;
        IVar18 = pIVar38->FocusScopeId;
        pIVar13->NavJustMovedToFocusScopeId = IVar18;
        pIVar13->NavJustMovedToKeyMods = pIVar13->NavMoveRequestKeyMods;
      }
      SetNavIDWithRectRel(IVar29,pIVar13->NavLayer,IVar18,&pIVar38->RectRel);
    }
  }
  if (pIVar33->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar33->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x2295,"void ImGui::NavUpdate()");
    }
    if (((pIVar33->NavMoveResultLocal).ID == 0) && ((pIVar33->NavMoveResultOther).ID == 0)) {
      pIVar33->NavDisableHighlight = false;
    }
    pIVar33->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar33->NavMousePosDirty == true) && (pIVar33->NavIdIsAlive == true)) {
    if ((((pIVar33->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar33->IO).BackendFlags & 4) != 0 && (pIVar33->NavDisableHighlight == false)) &&
         (pIVar33->NavDisableMouseHover == true)) && (pIVar33->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar44 = NavCalcPreferredRefPos();
      (pIVar33->IO).MousePosPrev = IVar44;
      (pIVar33->IO).MousePos = IVar44;
      (pIVar33->IO).WantSetMousePos = true;
    }
    pIVar33->NavMousePosDirty = false;
  }
  pIVar33->NavIdIsAlive = false;
  pIVar33->NavJustTabbedId = 0;
  IVar36 = pIVar33->NavLayer;
  if (ImGuiNavLayer_Menu < IVar36) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x22ab,"void ImGui::NavUpdate()");
  }
  pIVar24 = pIVar33->NavWindow;
  pIVar31 = pIVar24;
  if (pIVar24 != (ImGuiWindow *)0x0) {
    for (; pIVar31 != (ImGuiWindow *)0x0; pIVar31 = pIVar31->ParentWindow) {
      if ((pIVar31->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar31 != pIVar24) {
          pIVar31->NavLastChildNavWindow = pIVar24;
        }
        break;
      }
    }
    if ((IVar36 == ImGuiNavLayer_Main) && (pIVar24->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar24->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar13 = GImGui;
  pIVar24 = GetTopMostPopupModal();
  if (pIVar24 != (ImGuiWindow *)0x0) {
    pIVar13->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar13->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar13->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar42 = (pIVar13->IO).DeltaTime * -10.0 + pIVar13->NavWindowingHighlightAlpha;
    fVar42 = (float)(-(uint)(0.0 <= fVar42) & (uint)fVar42);
    pIVar13->NavWindowingHighlightAlpha = fVar42;
    if ((pIVar13->DimBgRatio <= 0.0) && (fVar42 <= 0.0)) {
      pIVar13->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar24 == (ImGuiWindow *)0x0) && (pIVar13->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    bVar14 = IsNavInputTest(3,ImGuiInputReadMode_Pressed);
    if ((pIVar13->NavWindowingTarget == (ImGuiWindow *)0x0) &&
       (((pIVar13->IO).KeyCtrl == true && (bVar15 = IsKeyPressedMap(0,true), bVar15)))) {
      bVar39 = (byte)(pIVar13->IO).ConfigFlags;
      uVar41 = (uint)bVar39;
      if (bVar14 || (bVar39 & 1) != 0) {
LAB_00173164:
        pIVar24 = pIVar13->NavWindow;
        if ((pIVar24 != (ImGuiWindow *)0x0) ||
           (pIVar24 = FindWindowNavFocusable((pIVar13->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
           pIVar24 != (ImGuiWindow *)0x0)) {
          pIVar24 = pIVar24->RootWindow;
          pIVar13->NavWindowingTargetAnim = pIVar24;
          pIVar13->NavWindowingTarget = pIVar24;
          pIVar13->NavWindowingTimer = 0.0;
          pIVar13->NavWindowingHighlightAlpha = 0.0;
          pIVar13->NavWindowingToggleLayer = (bool)(~(byte)uVar41 & 1);
          pIVar13->NavInputSource = ImGuiInputSource_NavGamepad - (uVar41 & 1);
        }
      }
    }
    else if (bVar14) {
      uVar41 = 0;
      goto LAB_00173164;
    }
  }
  fVar42 = (pIVar13->IO).DeltaTime + pIVar13->NavWindowingTimer;
  pIVar13->NavWindowingTimer = fVar42;
  local_38 = pIVar12;
  if (pIVar13->NavWindowingTarget == (ImGuiWindow *)0x0) {
LAB_00173342:
    bVar14 = false;
    pIVar24 = (ImGuiWindow *)0x0;
  }
  else {
    IVar20 = pIVar13->NavInputSource;
    if (IVar20 != ImGuiInputSource_NavGamepad) {
LAB_001732b5:
      if (IVar20 == ImGuiInputSource_NavKeyboard) {
        fVar50 = (pIVar13->NavWindowingTimer + -0.2) / 0.05;
        fVar42 = 1.0;
        if (fVar50 <= 1.0) {
          fVar42 = fVar50;
        }
        fVar42 = (float)(~-(uint)(fVar50 < 0.0) & (uint)fVar42);
        uVar41 = -(uint)(fVar42 <= pIVar13->NavWindowingHighlightAlpha);
        pIVar13->NavWindowingHighlightAlpha =
             (float)(uVar41 & (uint)pIVar13->NavWindowingHighlightAlpha | ~uVar41 & (uint)fVar42);
        bVar14 = IsKeyPressedMap(0,true);
        if (bVar14) {
          NavUpdateWindowingHighlightWindow((pIVar13->IO).KeyShift - 1 | 1);
        }
        if ((pIVar13->IO).KeyCtrl == false) {
          pIVar24 = pIVar13->NavWindowingTarget;
          bVar14 = false;
          goto LAB_00173348;
        }
      }
      goto LAB_00173342;
    }
    fVar50 = (fVar42 + -0.2) / 0.05;
    fVar42 = 1.0;
    if (fVar50 <= 1.0) {
      fVar42 = fVar50;
    }
    fVar42 = (float)(~-(uint)(fVar50 < 0.0) & (uint)fVar42);
    uVar41 = -(uint)(fVar42 <= pIVar13->NavWindowingHighlightAlpha);
    pIVar13->NavWindowingHighlightAlpha =
         (float)(uVar41 & (uint)pIVar13->NavWindowingHighlightAlpha | ~uVar41 & (uint)fVar42);
    bVar14 = IsNavInputTest(0xc,ImGuiInputReadMode_RepeatSlow);
    bVar15 = IsNavInputTest(0xd,ImGuiInputReadMode_RepeatSlow);
    if ((uint)bVar14 - (uint)bVar15 != 0) {
      NavUpdateWindowingHighlightWindow((uint)bVar14 - (uint)bVar15);
      pIVar13->NavWindowingHighlightAlpha = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) {
      if (pIVar13->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_00173342;
      IVar20 = pIVar13->NavInputSource;
      goto LAB_001732b5;
    }
    pbVar32 = &pIVar13->NavWindowingToggleLayer;
    *pbVar32 = (bool)(*pbVar32 &
                     (pIVar13->NavWindowingHighlightAlpha <= 1.0 &&
                     pIVar13->NavWindowingHighlightAlpha != 1.0));
    if (*pbVar32 == false) {
      pIVar24 = pIVar13->NavWindowingTarget;
      bVar14 = false;
    }
    else {
      bVar14 = pIVar13->NavWindow != (ImGuiWindow *)0x0;
      pIVar24 = (ImGuiWindow *)0x0;
    }
    pIVar13->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_00173348:
  dir_sources = 1;
  bVar15 = IsNavInputTest(0x10,ImGuiInputReadMode_Pressed);
  if (bVar15) {
    pIVar13->NavWindowingToggleLayer = true;
  }
  if ((((pIVar13->ActiveId == 0) || (pIVar13->ActiveIdAllowOverlap == true)) &&
      (pIVar13->NavWindowingToggleLayer == true)) &&
     (bVar15 = IsNavInputTest(0x10,ImGuiInputReadMode_Released), bVar15)) {
    bVar15 = IsMousePosValid(&(pIVar13->IO).MousePos);
    bVar16 = IsMousePosValid(&(pIVar13->IO).MousePosPrev);
    bVar14 = (bool)(bVar16 == bVar15 | bVar14);
  }
  pIVar31 = pIVar13->NavWindowingTarget;
  if ((pIVar31 != (ImGuiWindow *)0x0) && ((pIVar31->Flags & 4) == 0)) {
    if (pIVar13->NavInputSource == ImGuiInputSource_NavGamepad) {
      dir_sources = 4;
LAB_00173426:
      IVar44 = GetNavInputAmount2d(dir_sources,ImGuiInputReadMode_Down,0.0,0.0);
    }
    else {
      IVar44.x = 0.0;
      IVar44.y = 0.0;
      if ((pIVar13->NavInputSource == ImGuiInputSource_NavKeyboard) &&
         ((pIVar13->IO).KeyShift == false)) goto LAB_00173426;
    }
    fVar42 = IVar44.x;
    fVar50 = IVar44.y;
    if ((((fVar42 != 0.0) || (NAN(fVar42))) || (fVar50 != 0.0)) || (NAN(fVar50))) {
      fVar51 = (pIVar13->IO).DisplayFramebufferScale.x;
      fVar52 = (pIVar13->IO).DisplayFramebufferScale.y;
      if (fVar52 <= fVar51) {
        fVar51 = fVar52;
      }
      fVar51 = (float)(int)(fVar51 * (pIVar13->IO).DeltaTime * 800.0);
      pIVar31 = pIVar31->RootWindow;
      local_48.Min.y = (pIVar31->Pos).y + fVar50 * fVar51;
      local_48.Min.x = (pIVar31->Pos).x + fVar42 * fVar51;
      SetWindowPos(pIVar31,&local_48.Min,1);
      MarkIniSettingsDirty(pIVar31);
      pIVar13->NavDisableMouseHover = true;
    }
  }
  if (pIVar24 != (ImGuiWindow *)0x0) {
    if ((pIVar13->NavWindow == (ImGuiWindow *)0x0) || (pIVar24 != pIVar13->NavWindow->RootWindow)) {
      ClearActiveID();
      pIVar13->NavDisableHighlight = false;
      pIVar13->NavDisableMouseHover = true;
      pIVar31 = pIVar24->NavLastChildNavWindow;
      if ((pIVar31 == (ImGuiWindow *)0x0) || (pIVar31->WasActive == false)) {
        pIVar31 = pIVar24;
      }
      ClosePopupsOverWindow(pIVar31,false);
      FocusWindow(pIVar31);
      if (pIVar31->NavLastIds[0] == 0) {
        NavInitWindow(pIVar31,false);
      }
      if ((pIVar31->DC).NavLayerActiveMask == 2) {
        pIVar13->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar13->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar14) && (pIVar24 = pIVar13->NavWindow, pIVar31 = pIVar24, pIVar24 != (ImGuiWindow *)0x0))
  {
    while (window = pIVar31, window->ParentWindow != (ImGuiWindow *)0x0) {
      if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
         (pIVar31 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
    }
    if (window != pIVar24) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar24;
      pIVar24 = pIVar13->NavWindow;
    }
    pIVar13->NavDisableHighlight = false;
    pIVar13->NavDisableMouseHover = true;
    IVar36 = ImGuiNavLayer_Main;
    if (((pIVar24->DC).NavLayerActiveMask & 2) != 0) {
      IVar36 = pIVar13->NavLayer ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(IVar36);
  }
  if (((bool)((uVar40 & 1) == 0 & (bVar11 ^ 1))) || (pIVar33->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar33->IO).NavActive = false;
LAB_0017361d:
    bVar14 = pIVar33->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar14 = (pIVar33->NavWindow->Flags & 0x40000U) == 0;
    (pIVar33->IO).NavActive = bVar14;
    if (((!bVar14) || (pIVar33->NavId == 0)) ||
       (bVar14 = true, pIVar33->NavDisableHighlight != false)) goto LAB_0017361d;
  }
  (pIVar33->IO).NavVisible = bVar14;
  bVar14 = IsNavInputTest(1,ImGuiInputReadMode_Pressed);
  if (bVar14) {
    if (pIVar33->ActiveId == 0) {
      pIVar24 = pIVar33->NavWindow;
      if (((pIVar24 == (ImGuiWindow *)0x0) || ((pIVar24->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar24->ParentWindow == (ImGuiWindow *)0x0)) {
        if ((pIVar33->OpenPopupStack).Size < 1) {
          if (pIVar33->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar24 != (ImGuiWindow *)0x0) && ((pIVar24->Flags & 0x5000000U) != 0x1000000)) {
              pIVar24->NavLastIds[0] = 0;
            }
            pIVar33->NavId = 0;
            pIVar33->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else {
          pIVar25 = ImVector<ImGuiPopupData>::back(&pIVar33->OpenPopupStack);
          if ((pIVar25->Window->Flags & 0x8000000) == 0) {
            ClosePopupToLevel((pIVar33->OpenPopupStack).Size + -1,true);
          }
        }
      }
      else {
        if (pIVar24->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                        ,0x22c8,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar24->ParentWindow);
        SetNavID(pIVar24->ChildId,0,0);
        pIVar33->NavIdIsAlive = false;
        if (pIVar33->NavDisableMouseHover == true) {
          pIVar33->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar33->NavActivateId = 0;
  pIVar33->NavActivateDownId = 0;
  pIVar33->NavActivatePressedId = 0;
  pIVar33->NavInputId = 0;
  if (((pIVar33->NavId == 0) || (pIVar33->NavDisableHighlight != false)) ||
     (pIVar33->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_001737be:
    pIVar24 = pIVar33->NavWindow;
    if (pIVar24 == (ImGuiWindow *)0x0) goto LAB_00173827;
    if ((pIVar24->Flags & 0x40000) != 0) {
      pIVar33->NavDisableHighlight = true;
    }
    bVar14 = false;
  }
  else {
    if (pIVar33->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar33->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          bVar14 = IsNavInputTest(0,ImGuiInputReadMode_Pressed);
          IVar29 = pIVar33->ActiveId;
          IVar18 = pIVar33->NavId;
          if (IVar29 == 0 && bVar14) {
            pIVar33->NavActivateId = IVar18;
            pIVar33->NavActivateDownId = IVar18;
LAB_00173bee:
            pIVar33->NavActivatePressedId = IVar18;
          }
          else if (IVar29 == 0) {
            pIVar33->NavActivateDownId = IVar18;
            if (bVar14) goto LAB_00173bee;
          }
          else {
            bVar15 = IVar29 == IVar18;
            if (!bVar15) goto LAB_001737be;
            pIVar33->NavActivateDownId = IVar29;
            IVar18 = IVar29;
            if (bVar14 && bVar15) goto LAB_00173bee;
          }
LAB_00173bf6:
          bVar14 = IsNavInputTest(2,ImGuiInputReadMode_Pressed);
          if (bVar14) {
            pIVar33->NavInputId = pIVar33->NavId;
          }
        }
        else if (pIVar33->ActiveId == pIVar33->NavId || pIVar33->ActiveId == 0) goto LAB_00173bf6;
      }
      goto LAB_001737be;
    }
LAB_00173827:
    bVar14 = true;
    pIVar24 = (ImGuiWindow *)0x0;
  }
  IVar29 = pIVar33->NavActivateId;
  if ((IVar29 != 0) && (pIVar33->NavActivateDownId != IVar29)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x22f6,"void ImGui::NavUpdate()");
  }
  pIVar33->NavMoveRequest = false;
  IVar29 = pIVar33->NavNextActivateId;
  if (IVar29 != 0) {
    pIVar33->NavActivateId = IVar29;
    pIVar33->NavActivateDownId = IVar29;
    pIVar33->NavActivatePressedId = IVar29;
    pIVar33->NavInputId = IVar29;
  }
  pIVar33->NavNextActivateId = 0;
  if (pIVar33->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar33->NavMoveDir = -1;
    pIVar33->NavMoveRequestFlags = 0;
    if (((!bVar14) && (pIVar33->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar24->Flags & 0x40000) == 0)) {
      if (((GImGui->ActiveIdUsingNavDirMask & 1) == 0) &&
         ((bVar14 = IsNavInputTest(4,ImGuiInputReadMode_Repeat), bVar14 ||
          (bVar14 = IsNavInputTest(0x11,ImGuiInputReadMode_Repeat), bVar14)))) {
        pIVar33->NavMoveDir = 0;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 2) == 0) &&
         ((bVar14 = IsNavInputTest(5,ImGuiInputReadMode_Repeat), bVar14 ||
          (bVar14 = IsNavInputTest(0x12,ImGuiInputReadMode_Repeat), bVar14)))) {
        pIVar33->NavMoveDir = 1;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 4) == 0) &&
         ((bVar14 = IsNavInputTest(6,ImGuiInputReadMode_Repeat), bVar14 ||
          (bVar14 = IsNavInputTest(0x13,ImGuiInputReadMode_Repeat), bVar14)))) {
        pIVar33->NavMoveDir = 2;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 8) == 0) &&
         ((bVar14 = IsNavInputTest(7,ImGuiInputReadMode_Repeat), bVar14 ||
          (bVar14 = IsNavInputTest(0x14,ImGuiInputReadMode_Repeat), bVar14)))) {
        pIVar33->NavMoveDir = 3;
      }
    }
    pIVar33->NavMoveClipDir = pIVar33->NavMoveDir;
  }
  else {
    if ((pIVar33->NavMoveDir == -1) || (pIVar33->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x2311,"void ImGui::NavUpdate()");
    }
    if (pIVar33->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x2312,"void ImGui::NavUpdate()");
    }
    pIVar33->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar12 = GImGui;
  fVar42 = 0.0;
  if ((((((uVar40 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar24 = GImGui->NavWindow, pIVar24 != (ImGuiWindow *)0x0)) &&
      (((pIVar24->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    bVar14 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar16 = false;
    bVar15 = false;
    if (bVar14) {
      bVar15 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar14 = IsKeyDown((pIVar12->IO).KeyMap[6]);
    if (bVar14) {
      bVar16 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar14 = IsKeyPressed((pIVar12->IO).KeyMap[7],true);
    if (bVar14) {
      bVar14 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar14 = false;
    }
    bVar17 = IsKeyPressed((pIVar12->IO).KeyMap[8],true);
    if (bVar17) {
      bVar17 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar17 = false;
    }
    fVar42 = 0.0;
    if ((bVar15 != bVar16) || (bVar14 != bVar17)) {
      if (((pIVar24->DC).NavLayerActiveMask == 0) && ((pIVar24->DC).NavHasScroll == true)) {
        bVar15 = IsKeyPressed((pIVar12->IO).KeyMap[5],true);
        if (bVar15) {
          fVar42 = (pIVar24->Scroll).y - ((pIVar24->InnerRect).Max.y - (pIVar24->InnerRect).Min.y);
LAB_00174cfe:
          (pIVar24->ScrollTarget).y = fVar42;
        }
        else {
          bVar15 = IsKeyPressed((pIVar12->IO).KeyMap[6],true);
          if (bVar15) {
            fVar42 = ((pIVar24->InnerRect).Max.y - (pIVar24->InnerRect).Min.y) + (pIVar24->Scroll).y
            ;
            goto LAB_00174cfe;
          }
          if (bVar14 == false) {
            if (bVar17 == false) goto LAB_00174d11;
            fVar42 = (pIVar24->ScrollMax).y;
            goto LAB_00174cfe;
          }
          (pIVar24->ScrollTarget).y = 0.0;
        }
        (pIVar24->ScrollTargetCenterRatio).y = 0.0;
        (pIVar24->ScrollTargetEdgeSnapDist).y = 0.0;
LAB_00174d11:
        fVar42 = 0.0;
      }
      else {
        IVar36 = pIVar12->NavLayer;
        fVar42 = (pIVar24->InnerRect).Max.y;
        fVar50 = (pIVar24->InnerRect).Min.y;
        fVar51 = ImGuiWindow::CalcFontSize(pIVar24);
        fVar42 = (pIVar24->NavRectRel[IVar36].Max.y - pIVar24->NavRectRel[IVar36].Min.y) +
                 ((fVar42 - fVar50) - fVar51);
        fVar42 = (float)(~-(uint)(fVar42 <= 0.0) & (uint)fVar42);
        bVar15 = IsKeyPressed((pIVar12->IO).KeyMap[5],true);
        if (bVar15) {
          fVar42 = -fVar42;
          pIVar12->NavMoveDir = 3;
          pIVar12->NavMoveClipDir = 2;
          pIVar12->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar15 = IsKeyPressed((pIVar12->IO).KeyMap[6],true);
          if (!bVar15) {
            pIVar28 = pIVar24->NavRectRel + IVar36;
            if (bVar14 == false) {
              fVar42 = 0.0;
              if (bVar17 != false) {
                fVar50 = ((pIVar24->ScrollMax).y + (pIVar24->SizeFull).y) - (pIVar24->Scroll).y;
                pIVar24->NavRectRel[IVar36].Max.y = fVar50;
                pIVar24->NavRectRel[IVar36].Min.y = fVar50;
                fVar50 = (pIVar28->Min).x;
                pIVar5 = &pIVar24->NavRectRel[IVar36].Max;
                if (pIVar5->x <= fVar50 && fVar50 != pIVar5->x) {
                  pIVar24->NavRectRel[IVar36].Max.x = 0.0;
                  (pIVar28->Min).x = 0.0;
                }
                pIVar12->NavMoveDir = 2;
                pIVar12->NavMoveRequestFlags = 0x50;
              }
              goto LAB_001739f6;
            }
            fVar42 = -(pIVar24->Scroll).y;
            pIVar24->NavRectRel[IVar36].Max.y = fVar42;
            pIVar24->NavRectRel[IVar36].Min.y = fVar42;
            fVar42 = (pIVar28->Min).x;
            pIVar5 = &pIVar24->NavRectRel[IVar36].Max;
            if (pIVar5->x <= fVar42 && fVar42 != pIVar5->x) {
              pIVar24->NavRectRel[IVar36].Max.x = 0.0;
              (pIVar28->Min).x = 0.0;
            }
            pIVar12->NavMoveDir = 3;
            pIVar12->NavMoveRequestFlags = 0x50;
            goto LAB_00174d11;
          }
          pIVar12->NavMoveDir = 2;
          pIVar12->NavMoveClipDir = 3;
          pIVar12->NavMoveRequestFlags = 0x30;
        }
      }
    }
  }
LAB_001739f6:
  if (pIVar33->NavMoveDir == -1) {
    if ((pIVar33->NavMoveRequest & 1U) != 0) goto LAB_00173a35;
  }
  else {
    pIVar33->NavMoveRequest = true;
    pIVar33->NavMoveRequestKeyMods = (pIVar33->IO).KeyMods;
    pIVar33->NavMoveDirLast = pIVar33->NavMoveDir;
LAB_00173a35:
    if (pIVar33->NavId == 0) {
      pIVar33->NavInitRequest = true;
      pIVar33->NavInitRequestFromMove = true;
      pIVar33->NavInitResultId = 0;
      pIVar33->NavDisableHighlight = false;
    }
  }
  NavUpdateAnyRequestFlag();
  pIVar24 = pIVar33->NavWindow;
  if (((pIVar24 != (ImGuiWindow *)0x0) && ((pIVar24->Flags & 0x40000) == 0)) &&
     (pIVar33->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar50 = ImGuiWindow::CalcFontSize(pIVar24);
    fVar50 = (float)(int)(fVar50 * 100.0 * (pIVar33->IO).DeltaTime + 0.5);
    if ((((pIVar24->DC).NavLayerActiveMask == 0) && ((pIVar24->DC).NavHasScroll == true)) &&
       (pIVar33->NavMoveRequest == true)) {
      uVar40 = pIVar33->NavMoveDir;
      if (uVar40 < 2) {
        lVar23 = 0x7c;
        lVar30 = 0x74;
        lVar35 = 0x6c;
        uVar41 = 0;
        lStack_70 = 0x5c;
      }
      else {
        if ((uVar40 & 0xfffffffe) != 2) goto LAB_00173c93;
        uVar41 = 2;
        lVar23 = 0x80;
        lVar30 = 0x78;
        lVar35 = 0x70;
        lStack_70 = 0x60;
      }
      *(float *)((long)&pIVar24->Name + lVar35) =
           (float)(int)(*(float *)(&DAT_001b3b20 + (ulong)(uVar40 == uVar41) * 4) * fVar50 +
                       *(float *)((long)&pIVar24->Name + lStack_70));
      *(undefined4 *)((long)&pIVar24->Name + lVar30) = 0;
      *(undefined4 *)((long)&pIVar24->Name + lVar23) = 0;
    }
LAB_00173c93:
    IVar44 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar51 = IVar44.x;
    fVar52 = IVar44.y;
    if (((fVar51 != 0.0) || (NAN(fVar51))) && (pIVar24->ScrollbarX == true)) {
      (pIVar24->ScrollTarget).x = (float)(int)(fVar51 * fVar50 + (pIVar24->Scroll).x);
      (pIVar24->ScrollTargetCenterRatio).x = 0.0;
      (pIVar24->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar52 != 0.0) || (NAN(fVar52))) {
      (pIVar24->ScrollTarget).y = (float)(int)(fVar52 * fVar50 + (pIVar24->Scroll).y);
      (pIVar24->ScrollTargetCenterRatio).y = 0.0;
      (pIVar24->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  (pIVar33->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar33->NavMoveResultLocal).ID = 0;
  (pIVar33->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar33->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar33->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar33->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar33->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar33->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar33->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar33->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar33->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar33->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar33->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar33->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar33->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar33->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar33->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar33->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar33->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar33->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar33->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar33->NavMoveResultOther).ID = 0;
  (pIVar33->NavMoveResultOther).FocusScopeId = 0;
  (pIVar33->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar33->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar33->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar33->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar33->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar33->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar33->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((pIVar33->NavMoveRequest == true) && (pIVar33->NavInputSource == ImGuiInputSource_NavGamepad)
      ) && (pIVar33->NavLayer == ImGuiNavLayer_Main)) {
    pIVar24 = pIVar33->NavWindow;
    IVar44 = (pIVar24->InnerRect).Min;
    fVar50 = (pIVar24->Pos).x;
    fVar51 = (pIVar24->Pos).y;
    IVar45 = (pIVar24->InnerRect).Max;
    local_48.Max.x = (IVar45.x - fVar50) + 1.0;
    local_48.Max.y = (IVar45.y - fVar51) + 1.0;
    local_48.Min.y = (IVar44.y - fVar51) + -1.0;
    local_48.Min.x = (IVar44.x - fVar50) + -1.0;
    bVar14 = ImRect::Contains(&local_48,pIVar24->NavRectRel);
    if (!bVar14) {
      fVar50 = ImGuiWindow::CalcFontSize(pIVar24);
      auVar55._0_4_ = fVar50 * 0.5;
      auVar54._0_4_ = local_48.Max.x - local_48.Min.x;
      auVar54._4_4_ = local_48.Max.y - local_48.Min.y;
      auVar54._8_4_ = local_48.Max.x - local_48.Max.x;
      auVar54._12_4_ = local_48.Max.y - local_48.Max.y;
      auVar55._4_4_ = auVar55._0_4_;
      auVar55._8_4_ = auVar55._0_4_;
      auVar55._12_4_ = auVar55._0_4_;
      auVar55 = minps(auVar54,auVar55);
      local_48.Max.x = local_48.Max.x - auVar55._0_4_;
      local_48.Max.y = local_48.Max.y - auVar55._4_4_;
      local_48.Min.y = auVar55._4_4_ + local_48.Min.y;
      local_48.Min.x = auVar55._0_4_ + local_48.Min.x;
      ImRect::ClipWithFull(pIVar24->NavRectRel + pIVar33->NavLayer,&local_48);
      pIVar33->NavId = 0;
      pIVar33->NavFocusScopeId = 0;
    }
  }
  pIVar24 = pIVar33->NavWindow;
  if (pIVar24 == (ImGuiWindow *)0x0) {
    IVar44 = (GImGui->IO).DisplaySize;
    fVar52 = IVar44.x;
    fVar53 = IVar44.y;
    fVar50 = 0.0;
    fVar51 = 0.0;
  }
  else {
    IVar44 = pIVar24->NavRectRel[pIVar33->NavLayer].Min;
    IVar45 = pIVar24->NavRectRel[pIVar33->NavLayer].Max;
    fVar52 = (pIVar24->Pos).x;
    fVar50 = IVar44.x + fVar52;
    fVar53 = (pIVar24->Pos).y;
    fVar51 = IVar44.y + fVar53;
    fVar52 = IVar45.x + fVar52;
    fVar53 = IVar45.y + fVar53;
  }
  (pIVar33->NavScoringRect).Min.y = fVar51 + fVar42;
  (pIVar33->NavScoringRect).Max.y = fVar53 + fVar42;
  fVar43 = fVar50 + 1.0;
  if (fVar52 <= fVar50 + 1.0) {
    fVar43 = fVar52;
  }
  (pIVar33->NavScoringRect).Min.x = fVar43;
  (pIVar33->NavScoringRect).Max.x = fVar43;
  if (fVar53 + fVar42 < fVar51 + fVar42) {
    __assert_fail("!g.NavScoringRect.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x2361,"void ImGui::NavUpdate()");
  }
  pIVar33->NavScoringCount = 0;
  pIVar12 = GImGui;
  pIVar5 = &(GImGui->IO).MousePos;
  bVar14 = IsMousePosValid(pIVar5);
  if (bVar14) {
    IVar44 = (pIVar12->IO).MousePos;
    IVar45.x = (float)(int)IVar44.x;
    IVar45.y = (float)(int)IVar44.y;
    pIVar12->LastValidMousePos = IVar45;
    (pIVar12->IO).MousePos = IVar45;
  }
  bVar14 = IsMousePosValid(pIVar5);
  if ((bVar14) && (bVar14 = IsMousePosValid(&(pIVar12->IO).MousePosPrev), bVar14)) {
    IVar44 = (pIVar12->IO).MousePos;
    IVar45 = (pIVar12->IO).MousePosPrev;
    IVar46.x = IVar44.x - IVar45.x;
    IVar46.y = IVar44.y - IVar45.y;
    (pIVar12->IO).MouseDelta = IVar46;
    if (((IVar46.x != 0.0) || (NAN(IVar46.x))) || ((IVar46.y != 0.0 || (NAN(IVar46.y))))) {
      pIVar12->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar12->IO).MouseDelta.x = 0.0;
    (pIVar12->IO).MouseDelta.y = 0.0;
  }
  (pIVar12->IO).MousePosPrev = (pIVar12->IO).MousePos;
  for (lVar23 = 0; lVar23 != 5; lVar23 = lVar23 + 1) {
    if ((pIVar12->IO).MouseDown[lVar23] == true) {
      fVar42 = (pIVar12->IO).MouseDownDuration[lVar23];
      pbVar32 = (pIVar12->IO).MouseClicked + lVar23;
      *pbVar32 = fVar42 < 0.0;
      pbVar32[10] = false;
      (pIVar12->IO).MouseDownDurationPrev[lVar23] = fVar42;
      if (0.0 <= fVar42) {
        (pIVar12->IO).MouseDownDuration[lVar23] = fVar42 + (pIVar12->IO).DeltaTime;
        (pIVar12->IO).MouseDoubleClicked[lVar23] = false;
        bVar14 = IsMousePosValid(pIVar5);
        auVar49 = ZEXT816(0);
        if (bVar14) {
          IVar44 = (pIVar12->IO).MousePos;
          IVar45 = (pIVar12->IO).MouseClickedPos[lVar23];
          auVar49._0_4_ = IVar44.x - IVar45.x;
          auVar49._4_4_ = IVar44.y - IVar45.y;
          auVar49._8_8_ = 0;
        }
        fVar42 = (pIVar12->IO).MouseDragMaxDistanceSqr[lVar23];
        fVar50 = auVar49._0_4_ * auVar49._0_4_ + auVar49._4_4_ * auVar49._4_4_;
        uVar40 = -(uint)(fVar50 <= fVar42);
        (pIVar12->IO).MouseDragMaxDistanceSqr[lVar23] =
             (float)(~uVar40 & (uint)fVar50 | (uint)fVar42 & uVar40);
        IVar44 = (pIVar12->IO).MouseDragMaxDistanceAbs[lVar23];
        fVar42 = IVar44.x;
        fVar50 = IVar44.y;
        auVar56._0_8_ = auVar49._0_8_ ^ 0x8000000080000000;
        auVar56._8_4_ = auVar49._8_4_ ^ 0x80000000;
        auVar56._12_4_ = auVar49._12_4_ ^ 0x80000000;
        auVar55 = maxps(auVar56,auVar49);
        uVar40 = -(uint)(auVar55._0_4_ <= fVar42);
        uVar41 = -(uint)(auVar55._4_4_ <= fVar50);
        (pIVar12->IO).MouseDragMaxDistanceAbs[lVar23] =
             (ImVec2)(CONCAT44(~uVar41 & (uint)auVar55._4_4_,~uVar40 & (uint)auVar55._0_4_) |
                     CONCAT44((uint)fVar50 & uVar41,(uint)fVar42 & uVar40));
      }
      else {
        (pIVar12->IO).MouseDownDuration[lVar23] = 0.0;
        (pIVar12->IO).MouseDoubleClicked[lVar23] = false;
        dVar47 = pIVar12->Time;
        if ((float)(dVar47 - (pIVar12->IO).MouseClickedTime[lVar23]) <
            (pIVar12->IO).MouseDoubleClickTime) {
          bVar14 = IsMousePosValid(pIVar5);
          fVar42 = 0.0;
          fVar50 = 0.0;
          if (bVar14) {
            IVar44 = (pIVar12->IO).MousePos;
            IVar45 = (pIVar12->IO).MouseClickedPos[lVar23];
            fVar42 = IVar44.x - IVar45.x;
            fVar50 = IVar44.y - IVar45.y;
          }
          fVar51 = (pIVar12->IO).MouseDoubleClickMaxDist;
          if (fVar42 * fVar42 + fVar50 * fVar50 < fVar51 * fVar51) {
            (pIVar12->IO).MouseDoubleClicked[lVar23] = true;
          }
          dVar47 = (double)((pIVar12->IO).MouseDoubleClickTime * -2.0);
        }
        (pIVar12->IO).MouseClickedTime[lVar23] = dVar47;
        (pIVar12->IO).MouseClickedPos[lVar23] = (pIVar12->IO).MousePos;
        (pIVar12->IO).MouseDownWasDoubleClick[lVar23] = (pIVar12->IO).MouseDoubleClicked[lVar23];
        pIVar6 = (pIVar12->IO).MouseDragMaxDistanceAbs + lVar23;
        pIVar6->x = 0.0;
        pIVar6->y = 0.0;
        (pIVar12->IO).MouseDragMaxDistanceSqr[lVar23] = 0.0;
      }
    }
    else {
      (pIVar12->IO).MouseClicked[lVar23] = false;
      fVar42 = (pIVar12->IO).MouseDownDuration[lVar23];
      (pIVar12->IO).MouseReleased[lVar23] = 0.0 <= fVar42;
      pbVar32 = (pIVar12->IO).MouseClicked + lVar23;
      (pIVar12->IO).MouseDownDurationPrev[lVar23] = fVar42;
      (pIVar12->IO).MouseDownDuration[lVar23] = -1.0;
      (pIVar12->IO).MouseDoubleClicked[lVar23] = false;
    }
    if (((pIVar12->IO).MouseDown[lVar23] == false) && ((pIVar12->IO).MouseReleased[lVar23] == false)
       ) {
      (pIVar12->IO).MouseDownWasDoubleClick[lVar23] = false;
    }
    if (*pbVar32 == true) {
      pIVar12->NavDisableMouseHover = false;
    }
  }
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar24 = GetTopMostPopupModal();
  pIVar12 = local_38;
  if ((pIVar24 != (ImGuiWindow *)0x0) ||
     ((local_38->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < local_38->NavWindowingHighlightAlpha)))) {
    fVar42 = (local_38->IO).DeltaTime * 6.0 + local_38->DimBgRatio;
    if (1.0 <= fVar42) {
      fVar42 = 1.0;
    }
    local_38->DimBgRatio = fVar42;
  }
  else {
    fVar42 = (local_38->IO).DeltaTime * -10.0 + local_38->DimBgRatio;
    local_38->DimBgRatio = (float)(-(uint)(0.0 <= fVar42) & (uint)fVar42);
  }
  local_38->MouseCursor = 0;
  local_38->WantTextInputNextFrame = -1;
  local_38->WantCaptureMouseNextFrame = -1;
  local_38->WantCaptureKeyboardNextFrame = -1;
  (local_38->PlatformImePos).x = 1.0;
  pIVar33 = GImGui;
  (local_38->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar14 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar14) &&
        (fVar42 = (pIVar33->IO).MouseDragThreshold,
        fVar50 = (pIVar33->IO).MousePos.x - (pIVar33->WheelingWindowRefMousePos).x,
        fVar51 = (pIVar33->IO).MousePos.y - (pIVar33->WheelingWindowRefMousePos).y,
        fVar42 * fVar42 < fVar50 * fVar50 + fVar51 * fVar51)) ||
       (pIVar33->WheelingWindowTimer <= 0.0)) {
      pIVar33->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar33->WheelingWindowTimer = 0.0;
    }
  }
  fVar42 = (pIVar33->IO).MouseWheel;
  if (((((fVar42 != 0.0) || (fVar50 = (pIVar33->IO).MouseWheelH, fVar50 != 0.0)) || (NAN(fVar50)))
      && ((pIVar33->ActiveId == 0 || (pIVar33->ActiveIdUsingMouseWheel == false)))) &&
     (((pIVar33->HoveredIdPreviousFrame == 0 ||
       (pIVar33->HoveredIdPreviousFrameUsingMouseWheel == false)) &&
      (((pIVar24 = pIVar33->WheelingWindow, pIVar24 != (ImGuiWindow *)0x0 ||
        (pIVar24 = pIVar33->HoveredWindow, pIVar24 != (ImGuiWindow *)0x0)) &&
       (pIVar24->Collapsed == false)))))) {
    if ((fVar42 != 0.0) || (NAN(fVar42))) {
      if ((pIVar33->IO).KeyCtrl == true) {
        if ((pIVar33->IO).FontAllowUserScaling == true) {
          StartLockWheelingWindow(pIVar24);
          fVar42 = pIVar24->FontWindowScale;
          fVar51 = (pIVar33->IO).MouseWheel * 0.1 + fVar42;
          fVar50 = 2.5;
          if (fVar51 <= 2.5) {
            fVar50 = fVar51;
          }
          fVar50 = (float)(-(uint)(fVar51 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar51 < 0.5) & (uint)fVar50);
          pIVar24->FontWindowScale = fVar50;
          if ((pIVar24->Flags & 0x1000000) == 0) {
            fVar50 = fVar50 / fVar42;
            IVar44 = pIVar24->Size;
            IVar45 = (pIVar33->IO).MousePos;
            fVar42 = (pIVar24->Pos).x;
            fVar51 = (pIVar24->Pos).y;
            auVar57._0_4_ = (IVar45.x - fVar42) * (1.0 - fVar50) * IVar44.x;
            auVar57._4_4_ = (IVar45.y - fVar51) * (1.0 - fVar50) * IVar44.y;
            auVar57._8_8_ = 0;
            auVar10._8_8_ = 0;
            auVar10._0_4_ = IVar44.x;
            auVar10._4_4_ = IVar44.y;
            auVar55 = divps(auVar57,auVar10);
            local_48.Min.x = auVar55._0_4_ + fVar42;
            local_48.Min.y = auVar55._4_4_ + fVar51;
            SetWindowPos(pIVar24,&local_48.Min,0);
            IVar48.x = (float)(int)((pIVar24->Size).x * fVar50);
            IVar48.y = (float)(int)((pIVar24->Size).y * fVar50);
            IVar9.y = (float)(int)((pIVar24->SizeFull).y * fVar50);
            IVar9.x = (float)(int)((pIVar24->SizeFull).x * fVar50);
            pIVar24->Size = IVar48;
            pIVar24->SizeFull = IVar9;
          }
          goto LAB_001743d0;
        }
      }
      else if ((pIVar33->IO).KeyShift == false) {
        StartLockWheelingWindow(pIVar24);
        while ((uVar40 = pIVar24->Flags, (uVar40 >> 0x18 & 1) != 0 &&
               (((uVar40 & 0x210) == 0x10 ||
                ((fVar50 = (pIVar24->ScrollMax).y, fVar50 == 0.0 && (!NAN(fVar50)))))))) {
          pIVar24 = pIVar24->ParentWindow;
        }
        if ((uVar40 & 0x210) == 0) {
          fVar51 = ((pIVar24->InnerRect).Max.y - (pIVar24->InnerRect).Min.y) * 0.67;
          fVar52 = ImGuiWindow::CalcFontSize(pIVar24);
          fVar50 = fVar52 * 5.0;
          if (fVar51 <= fVar52 * 5.0) {
            fVar50 = fVar51;
          }
          (pIVar24->ScrollTarget).y = (pIVar24->Scroll).y - fVar42 * (float)(int)fVar50;
          (pIVar24->ScrollTargetCenterRatio).y = 0.0;
          (pIVar24->ScrollTargetEdgeSnapDist).y = 0.0;
        }
      }
    }
    fVar42 = (pIVar33->IO).MouseWheelH;
    if (((fVar42 == 0.0) && (!NAN(fVar42))) || ((pIVar33->IO).KeyShift == true)) {
      fVar42 = (pIVar33->IO).MouseWheel;
      if (((fVar42 == 0.0) && (!NAN(fVar42))) || ((pIVar33->IO).KeyShift != true))
      goto LAB_001743d0;
    }
    if ((pIVar33->IO).KeyCtrl == false) {
      StartLockWheelingWindow(pIVar24);
      while ((uVar40 = pIVar24->Flags, (uVar40 >> 0x18 & 1) != 0 &&
             (((uVar40 & 0x210) == 0x10 ||
              ((fVar50 = (pIVar24->ScrollMax).x, fVar50 == 0.0 && (!NAN(fVar50)))))))) {
        pIVar24 = pIVar24->ParentWindow;
      }
      if ((uVar40 & 0x210) == 0) {
        fVar51 = ((pIVar24->InnerRect).Max.x - (pIVar24->InnerRect).Min.x) * 0.67;
        fVar52 = ImGuiWindow::CalcFontSize(pIVar24);
        fVar50 = fVar52 + fVar52;
        if (fVar51 <= fVar52 + fVar52) {
          fVar50 = fVar51;
        }
        (pIVar24->ScrollTarget).x = (pIVar24->Scroll).x - fVar42 * (float)(int)fVar50;
        (pIVar24->ScrollTargetCenterRatio).x = 0.0;
        (pIVar24->ScrollTargetEdgeSnapDist).x = 0.0;
      }
    }
  }
LAB_001743d0:
  pIVar33 = GImGui;
  pIVar24 = GImGui->NavWindow;
  if ((((pIVar24 == (ImGuiWindow *)0x0) || (pIVar24->Active != true)) ||
      ((pIVar24->Flags & 0x40000) != 0)) || ((GImGui->IO).KeyCtrl != false)) {
    bVar14 = false;
  }
  else {
    bVar14 = IsKeyPressedMap(0,true);
  }
  pIVar33->FocusTabPressed = bVar14;
  if ((bVar14 == false) || (pIVar33->ActiveId != 0)) {
    pIVar24 = pIVar33->FocusRequestNextWindow;
  }
  else {
    pIVar24 = pIVar33->NavWindow;
    pIVar33->FocusRequestNextWindow = pIVar24;
    pIVar33->FocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar33->NavId == 0) || (pIVar33->NavIdTabCounter == 0x7fffffff)) {
      iVar21 = -(uint)(pIVar33->IO).KeyShift;
    }
    else {
      iVar21 = pIVar33->NavIdTabCounter + (-(uint)(pIVar33->IO).KeyShift | 1) + 1;
    }
    pIVar33->FocusRequestNextCounterTabStop = iVar21;
  }
  pIVar33->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar33->FocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar33->FocusRequestCurrCounterTabStop = 0x7fffffff;
  if (pIVar24 != (ImGuiWindow *)0x0) {
    pIVar33->FocusRequestCurrWindow = pIVar24;
    if ((pIVar33->FocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar21 = (pIVar24->DC).FocusCounterRegular, iVar21 != -1)) {
      pIVar33->FocusRequestCurrCounterRegular =
           (pIVar33->FocusRequestNextCounterRegular + iVar21 + 1) % (iVar21 + 1);
    }
    if ((pIVar33->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar21 = (pIVar24->DC).FocusCounterTabStop, iVar21 != -1)) {
      pIVar33->FocusRequestCurrCounterTabStop =
           (pIVar33->FocusRequestNextCounterTabStop + iVar21 + 1) % (iVar21 + 1);
    }
    pIVar33->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar33->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar33->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar33->NavIdTabCounter = 0x7fffffff;
  iVar21 = (pIVar12->WindowsFocusOrder).Size;
  if (iVar21 == (pIVar12->Windows).Size) {
    fVar42 = 3.4028235e+38;
    if ((pIVar12->GcCompactAll == false) &&
       (fVar50 = (pIVar12->IO).ConfigMemoryCompactTimer, 0.0 <= fVar50)) {
      fVar42 = (float)pIVar12->Time - fVar50;
    }
    for (i_00 = 0; i_00 != iVar21; i_00 = i_00 + 1) {
      ppIVar26 = ImVector<ImGuiWindow_*>::operator[](&pIVar12->Windows,i_00);
      pIVar24 = *ppIVar26;
      bVar14 = pIVar24->Active;
      pIVar24->WasActive = bVar14;
      pIVar24->BeginCount = 0;
      pIVar24->Active = false;
      pIVar24->WriteAccessed = false;
      if (((bVar14 == false) && (pIVar24->MemoryCompacted == false)) &&
         (pIVar24->LastTimeActive <= fVar42 && fVar42 != pIVar24->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar24);
      }
      iVar21 = (pIVar12->Windows).Size;
    }
    this = &pIVar12->TablesLastTimeActive;
    for (iVar21 = 0; iVar21 < this->Size; iVar21 = iVar21 + 1) {
      pfVar27 = ImVector<float>::operator[](this,iVar21);
      if ((0.0 <= *pfVar27) &&
         (pfVar27 = ImVector<float>::operator[](this,iVar21),
         *pfVar27 <= fVar42 && fVar42 != *pfVar27)) {
        table = ImVector<ImGuiTable>::operator[](&(pIVar12->Tables).Buf,iVar21);
        TableGcCompactTransientBuffers(table);
      }
    }
    if (pIVar12->GcCompactAll != false) {
      GcCompactTransientMiscBuffers();
    }
    pIVar12->GcCompactAll = false;
    if ((pIVar12->NavWindow != (ImGuiWindow *)0x0) && (pIVar12->NavWindow->WasActive == false)) {
      FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
    }
    ImVector<ImGuiWindow_*>::resize(&pIVar12->CurrentWindowStack,0);
    ImVector<ImGuiPopupData>::resize(&pIVar12->BeginPopupStack,0);
    ImVector<int>::resize(&pIVar12->ItemFlagsStack,0);
    local_48.Min = (ImVec2)((ulong)local_48.Min & 0xffffffff00000000);
    ImVector<int>::push_back(&pIVar12->ItemFlagsStack,(int *)&local_48);
    ImVector<ImGuiGroupData>::resize(&pIVar12->GroupStack,0);
    ClosePopupsOverWindow(pIVar12->NavWindow,false);
    pIVar33 = GImGui;
    GImGui->DebugItemPickerBreakId = 0;
    if (pIVar33->DebugItemPickerActive == true) {
      uVar40 = pIVar33->HoveredIdPreviousFrame;
      pIVar33->MouseCursor = 7;
      bVar14 = IsKeyPressedMap(0xe,true);
      if (bVar14) {
        pIVar33->DebugItemPickerActive = false;
      }
      pIVar13 = GImGui;
      fVar42 = (GImGui->IO).MouseDownDuration[0];
      if ((fVar42 != 0.0) || (NAN(fVar42))) {
        uVar41 = (uint)(uVar40 == 0);
      }
      else if (uVar40 == 0) {
        uVar41 = 1;
      }
      else {
        pIVar33->DebugItemPickerBreakId = uVar40;
        pIVar33->DebugItemPickerActive = false;
        uVar41 = 0;
      }
      pIVar3 = &pIVar13->NextWindowData;
      *(byte *)&pIVar3->Flags = (byte)pIVar3->Flags | 0x40;
      (pIVar13->NextWindowData).BgAlphaVal = 0.6;
      BeginTooltip();
      Text("HoveredId: 0x%08X",(ulong)uVar40);
      Text("Press ESC to abort picking.");
      TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar41 << 4)),
                  "Click to break in debugger!");
      EndTooltip();
      pIVar33 = GImGui;
    }
    pIVar12->WithinFrameScopeWithImplicitWindow = true;
    *(byte *)&(pIVar33->NextWindowData).Flags = (byte)(pIVar33->NextWindowData).Flags | 2;
    (pIVar33->NextWindowData).SizeVal.x = 400.0;
    (pIVar33->NextWindowData).SizeVal.y = 400.0;
    (pIVar33->NextWindowData).SizeCond = 4;
    Begin("Debug##Default",(bool *)0x0,0);
    if (pIVar12->CurrentWindow->IsFallbackWindow != false) {
      CallContextHooks(pIVar12,ImGuiContextHookType_NewFramePost);
      return;
    }
    __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0xf7d,"void ImGui::NewFrame()");
  }
  __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                ,0xf50,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleSegmentMaxError(g.Style.CircleSegmentMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    g.BackgroundDrawList._ResetForNewFrame();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();

    g.ForegroundDrawList._ResetForNewFrame();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_Default_);
    g.GroupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}